

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

int rounddiv(long x,int y)

{
  int local_20;
  int divsgn;
  int m;
  int r;
  int y_local;
  long x_local;
  
  local_20 = 1;
  if (y == 0) {
    panic("division by zero in rounddiv");
  }
  m = y;
  if (y < 0) {
    local_20 = -1;
    m = -y;
  }
  _r = x;
  if (x < 0) {
    local_20 = -local_20;
    _r = -x;
  }
  divsgn = (int)(_r / (long)m);
  if (m <= (int)(_r % (long)m) * 2) {
    divsgn = divsgn + 1;
  }
  return local_20 * divsgn;
}

Assistant:

int rounddiv(long x, int y)	/* calculate x/y, rounding as appropriate */
{
    int r, m;
    int divsgn = 1;

    if (y == 0)
	panic("division by zero in rounddiv");
    else if (y < 0) {
	divsgn = -divsgn;  y = -y;
    }
    if (x < 0) {
	divsgn = -divsgn;  x = -x;
    }
    r = x / y;
    m = x % y;
    if (2*m >= y) r++;

    return divsgn * r;
}